

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall
glslang::HlslGrammar::acceptArguments
          (HlslGrammar *this,TFunction *function,TIntermTyped **arguments)

{
  bool bVar1;
  char cVar2;
  TIntermTyped *arg;
  TIntermTyped *local_30;
  
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
  if (bVar1) {
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
    if (bVar1) {
      return true;
    }
    do {
      bVar1 = acceptAssignmentExpression(this,&local_30);
      cVar2 = '\x01';
      if (bVar1) {
        HlslParseContext::handleFunctionArgument(this->parseContext,function,arguments,local_30);
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
        cVar2 = !bVar1 * '\x02';
      }
    } while (cVar2 == '\0');
    if (cVar2 != '\x01') {
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
      if (bVar1) {
        return true;
      }
      (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
        [0x2d])(this->parseContext,&(this->super_HlslTokenStream).token,"Expected",")","");
      return false;
    }
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptArguments(TFunction* function, TIntermTyped*& arguments)
{
    // LEFT_PAREN
    if (! acceptTokenClass(EHTokLeftParen))
        return false;

    // RIGHT_PAREN
    if (acceptTokenClass(EHTokRightParen))
        return true;

    // must now be at least one expression...
    do {
        // expression
        TIntermTyped* arg;
        if (! acceptAssignmentExpression(arg))
            return false;

        // hook it up
        parseContext.handleFunctionArgument(function, arguments, arg);

        // COMMA
        if (! acceptTokenClass(EHTokComma))
            break;
    } while (true);

    // RIGHT_PAREN
    if (! acceptTokenClass(EHTokRightParen)) {
        expected(")");
        return false;
    }

    return true;
}